

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

ParsedExtensionMetaData *
duckdb::ExtensionHelper::ParseExtensionMetaData
          (ParsedExtensionMetaData *__return_storage_ptr__,FileHandle *handle)

{
  _Alloc_hider buffer;
  size_type nr_bytes;
  idx_t iVar1;
  InvalidInputException *this;
  allocator local_c9;
  string metadata_segment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string engine_platform;
  string engine_version;
  
  GetVersionDirectoryName_abi_cxx11_();
  DuckDB::Platform_abi_cxx11_();
  metadata_segment._M_dataplus._M_p = (pointer)&metadata_segment.field_2;
  metadata_segment._M_string_length = 0;
  metadata_segment.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)&metadata_segment);
  iVar1 = FileHandle::GetFileSize(handle);
  nr_bytes = metadata_segment._M_string_length;
  buffer = metadata_segment._M_dataplus;
  if (0x1ff < iVar1) {
    iVar1 = FileHandle::GetFileSize(handle);
    FileHandle::Read(handle,buffer._M_p,nr_bytes,iVar1 - 0x200);
    ParseExtensionMetaData(__return_storage_ptr__,metadata_segment._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&metadata_segment);
    ::std::__cxx11::string::~string((string *)&engine_platform);
    ::std::__cxx11::string::~string((string *)&engine_version);
    return __return_storage_ptr__;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,
             "File \'%s\' is not a DuckDB extension. Valid DuckDB extensions must be at least %llu bytes"
             ,&local_c9);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)&handle->path);
  InvalidInputException::InvalidInputException<std::__cxx11::string,unsigned_long>
            (this,&local_88,&local_a8,0x200);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ParsedExtensionMetaData ExtensionHelper::ParseExtensionMetaData(FileHandle &handle) {
	const string engine_version = string(ExtensionHelper::GetVersionDirectoryName());
	const string engine_platform = string(DuckDB::Platform());

	string metadata_segment;
	metadata_segment.resize(ParsedExtensionMetaData::FOOTER_SIZE);

	if (handle.GetFileSize() < ParsedExtensionMetaData::FOOTER_SIZE) {
		throw InvalidInputException(
		    "File '%s' is not a DuckDB extension. Valid DuckDB extensions must be at least %llu bytes", handle.path,
		    ParsedExtensionMetaData::FOOTER_SIZE);
	}

	handle.Read((void *)metadata_segment.data(), metadata_segment.size(),
	            handle.GetFileSize() - ParsedExtensionMetaData::FOOTER_SIZE);

	return ParseExtensionMetaData(metadata_segment.data());
}